

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_coroutine.hpp
# Opt level: O2

int __thiscall squall::Coroutine::yielded<int>(Coroutine *this)

{
  int iVar1;
  
  validate_vm(this);
  iVar1 = detail::FetchInt<(squall::detail::FetchContext)4,_int>::doit(this->vm_,-1);
  return iVar1;
}

Assistant:

R yielded() {
        validate_vm();
        return detail::fetch<R, detail::FetchContext::YieldedValue>(vm_, -1);
    }